

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

void drmp3_uninit(drmp3 *pMP3)

{
  if (pMP3 != (drmp3 *)0x0) {
    if (pMP3->onRead == drmp3__on_read_stdio) {
      fclose((FILE *)pMP3->pUserData);
    }
    free(pMP3->pData);
    return;
  }
  return;
}

Assistant:

void drmp3_uninit(drmp3* pMP3)
{
    if (pMP3 == NULL) {
        return;
    }

#ifndef DR_MP3_NO_STDIO
    if (pMP3->onRead == drmp3__on_read_stdio) {
        fclose((FILE*)pMP3->pUserData);
    }
#endif

    drmp3_free(pMP3->pData);
}